

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O3

int * Kit_TruthStatsArray(uint *pArray,int nVars,int nFuncs)

{
  byte bVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *vMemory;
  int *__ptr;
  ulong uVar4;
  
  piVar3 = (int *)calloc((long)nFuncs,4);
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  __ptr = (int *)malloc(0x40000);
  vMemory->pArray = __ptr;
  if (0 < nFuncs) {
    uVar4 = 0;
    bVar1 = (char)nVars - 5;
    if (nVars < 6) {
      bVar1 = 0;
    }
    do {
      iVar2 = Kit_TruthStats(pArray + ((int)uVar4 << (bVar1 & 0x1f)),nVars,vMemory);
      piVar3[uVar4] = iVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)nFuncs != uVar4);
    __ptr = vMemory->pArray;
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(vMemory);
  return piVar3;
}

Assistant:

int * Kit_TruthStatsArray( unsigned * pArray, int nVars, int nFuncs )
{
    int f, * pRes = ABC_CALLOC( int, nFuncs );
    int nInts = Abc_TruthWordNum( nVars );
    Vec_Int_t * vMemory = Vec_IntAlloc( 1 << 16 );
    for ( f = 0; f < nFuncs; f++ )
        pRes[f] = Kit_TruthStats( pArray + f*nInts, nVars, vMemory );
    Vec_IntFree( vMemory );
    return pRes;
}